

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffr2f(float fval,int decim,char *cval,int *status)

{
  int iVar1;
  char *pcVar2;
  int *in_RDX;
  char *in_RSI;
  uint in_EDI;
  float in_XMM0_Da;
  char *cptr;
  int local_4;
  
  if (*in_RDX < 1) {
    *in_RSI = '\0';
    if ((int)in_EDI < 0) {
      ffpmsg((char *)0x232bcd);
      *in_RDX = 0x19b;
      local_4 = 0x19b;
    }
    else {
      iVar1 = snprintf(in_RSI,0x47,"%.*f",(double)in_XMM0_Da,(ulong)in_EDI);
      if (iVar1 < 0) {
        ffpmsg((char *)0x232c1c);
        *in_RDX = 0x192;
      }
      pcVar2 = strchr(in_RSI,0x2c);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '.';
      }
      pcVar2 = strchr(in_RSI,0x4e);
      if (pcVar2 != (char *)0x0) {
        ffpmsg((char *)0x232c68);
        *in_RDX = 0x192;
      }
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffr2f(float fval,   /* I - value to be converted to a string */
          int  decim,   /* I - number of decimal places to display */
          char *cval,   /* O - character string representation of the value */
          int  *status) /* IO - error status */
/*
  convert float value to a null-terminated F format string
*/
{
    char *cptr;
        
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

    if (decim < 0)
    {
        ffpmsg("Error in ffr2f:  no. of decimal places < 0");
        return(*status = BAD_DECIM);
    }

    if (snprintf(cval, FLEN_VALUE,"%.*f", decim, fval) < 0)
    {
        ffpmsg("Error in ffr2f converting float to string");
        *status = BAD_F2C;
    }

    /* replace comma with a period (e.g. in French locale) */
    if ( (cptr = strchr(cval, ','))) *cptr = '.';

    /* test if output string is 'NaN', 'INDEF', or 'INF' */
    if (strchr(cval, 'N'))
    {
        ffpmsg("Error in ffr2f: float value is a NaN or INDEF");
        *status = BAD_F2C;
    }

    return(*status);
}